

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

gravity_value_t convert_list2string(gravity_vm *vm,gravity_list_t *list)

{
  uint uVar1;
  gravity_value_t *pgVar2;
  gravity_value_t gVar3;
  uint local_94;
  char *local_90;
  gravity_class_t *local_88;
  uint32_t len1;
  char *s1;
  gravity_value_t value2;
  gravity_string_t *string;
  gravity_value_t value;
  uint32_t i;
  uint32_t count;
  uint32_t pos;
  char *buffer;
  uint32_t len;
  gravity_list_t *list_local;
  gravity_vm *vm_local;
  gravity_value_t result;
  
  buffer._4_4_ = 0x200;
  _count = (char *)gravity_calloc((gravity_vm *)0x0,1,0x201);
  *_count = '[';
  i = 1;
  uVar1 = (uint)(list->array).n;
  for (value.field_1.n._4_4_ = 0; (uint)value.field_1.n._4_4_ < uVar1;
      value.field_1.n._4_4_ = value.field_1.n._4_4_ + 1) {
    pgVar2 = (list->array).p + (uint)value.field_1.n._4_4_;
    if ((pgVar2->isa == gravity_class_list) && ((gravity_list_t *)(pgVar2->field_1).n == list)) {
      value2.field_1.n = 0;
    }
    else {
      gVar3 = convert_value2string(vm,*pgVar2);
      s1 = (char *)gVar3.isa;
      if (s1 == (char *)0x0) {
        local_88 = (gravity_class_t *)0x0;
      }
      else {
        value2.isa = (gravity_class_t *)gVar3.field_1;
        local_88 = value2.isa;
      }
      value2.field_1.p = local_88;
    }
    if (value2.field_1.n == 0) {
      local_90 = "N/A";
      local_94 = 3;
    }
    else {
      local_90 = (char *)(value2.field_1.p)->objclass;
      local_94 = *(uint *)((long)&(value2.field_1.p)->identifier + 4);
    }
    if (buffer._4_4_ < local_94 + i + 2) {
      buffer._4_4_ = local_94 + i + 2 + buffer._4_4_;
      _count = (char *)gravity_realloc((gravity_vm *)0x0,_count,(ulong)buffer._4_4_);
    }
    memcpy(_count + i,local_90,(ulong)local_94);
    i = local_94 + i;
    if (value.field_1.n._4_4_ + 1 < uVar1) {
      _count[i] = ',';
      i = i + 1;
    }
  }
  _count[i] = ']';
  _count[i + 1] = '\0';
  gVar3 = gravity_string_to_value(vm,_count,i + 1);
  free(_count);
  return gVar3;
}

Assistant:

static inline gravity_value_t convert_list2string (gravity_vm *vm, gravity_list_t *list) {
    // allocate initial memory to a 512 buffer
    uint32_t len = 512;
    char *buffer = mem_alloc(NULL, len+1);
    buffer[0] = '[';
    uint32_t pos = 1;

    // loop to perform string concat
    uint32_t count = (uint32_t) marray_size(list->array);
    for (uint32_t i=0; i<count; ++i) {
        gravity_value_t value = marray_get(list->array, i);
        gravity_string_t *string;
        if (VALUE_ISA_LIST(value) && (VALUE_AS_LIST(value) == list)) {
            string = NULL;
        } else {
            gravity_value_t value2 = convert_value2string(vm, value);
            string = VALUE_ISA_VALID(value2) ? VALUE_AS_STRING(value2) : NULL;
        }

        char *s1 = (string) ? string->s : "N/A";
        uint32_t len1 = (string) ? string->len : 3;

        // check if buffer needs to be reallocated
        if (len1+pos+2 > len) {
            len = (len1+pos+2) + len;
            buffer = mem_realloc(NULL, buffer, len);
        }

        // copy string to new buffer
        memcpy(buffer+pos, s1, len1);
        pos += len1;

        // add separator
        if (i+1 < count) {
            memcpy(buffer+pos, ",", 1);
            pos += 1;
        }
    }

    // Write latest ] character
    memcpy(buffer+pos, "]", 1);
    buffer[++pos] = 0;

    gravity_value_t result = VALUE_FROM_STRING(vm, buffer, pos);
    mem_free(buffer);
    return result;
}